

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O2

void __thiscall cppcms::plugin::scope::~scope(scope *this)

{
  _Base_ptr p_Var1;
  _data *p_Var2;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> uStack_28;
  
  class_data();
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&class_data::d.lock);
  p_Var2 = (this->d).ptr_;
  p_Var1 = (p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var1 != &(p_Var2->objects)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&class_data::d.modules._M_t,(key_type *)(p_Var1 + 1));
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    p_Var2 = (this->d).ptr_;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
  ::clear(&(p_Var2->objects)._M_t);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  booster::hold_ptr<cppcms::plugin::scope::_data>::~hold_ptr(&this->d);
  return;
}

Assistant:

scope::~scope() 
{
	try {
		_class_data &cls = class_data();
		booster::unique_lock<booster::mutex> guard(cls.lock);
		for(std::map<std::string,booster::shared_ptr<booster::shared_object> >::iterator p=d->objects.begin();p!=d->objects.end();++p) {
			cls.modules.erase(p->first);
		}
		d->objects.clear();
	}
	catch(...) {}
}